

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetephem.cpp
# Opt level: O3

CEExecOptions * DefineOpts(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double default_val;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  CEExecOptions *in_RDI;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"planetephem","");
  CEExecOptions::CEExecOptions(in_RDI,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  paVar2 = &local_d0.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_f0.field_2._M_allocated_capacity = *psVar5;
    local_f0.field_2._8_8_ = plVar3[3];
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar5;
    local_f0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(in_RDI->super_CLOptions).program_desc_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"p,planet","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Planet number (1=Mercury, 2=Venus, 4=Mars, 5=Jupiter, 6=Saturn, 7=Uranus, 8=Neptune)",
             "");
  CLOptions::AddIntParam(&in_RDI->super_CLOptions,&local_f0,&local_d0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  CEExecOptions::AddObserverPars(in_RDI);
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"startJD","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Starting time as a Julian date. Default will be the current Julian date","");
  default_val = (double)CEDate::CurrentJD();
  CLOptions::AddDoubleParam(&in_RDI->super_CLOptions,&local_f0,&local_d0,default_val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"duration","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Duration for printing out results (in minutes). Results will be printed from \'startJD\' to \'startJD + duration\'. Default is for one 24 hour period"
             ,"");
  CLOptions::AddDoubleParam(&in_RDI->super_CLOptions,&local_f0,&local_d0,1440.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"step","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Number of minutes between each line of the print out.","");
  CLOptions::AddDoubleParam(&in_RDI->super_CLOptions,&local_f0,&local_d0,30.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"method","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "Method for computing planet positions (\'sofa\' or \'jpl\', default=\'sofa\')","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"sofa","");
  CLOptions::AddStringParam(&in_RDI->super_CLOptions,&local_f0,&local_d0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  CEExecOptions::AddCorrFilePars(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("planetephem");

    // Add version and description
    opts.AddProgramDescription(std::string() +
        "Returns the apparent ICRS RA,Dec and observed Az,Alt coordinates for " +
        "a given planet for a given observer. It is important also to note " +
        "observed coordinates will be dubious very close to the horizon due " +
        "to the atmospheric correction algorithms employed.");

    // Define the parameters
    opts.AddIntParam("p,planet",
                     "Planet number (1=Mercury, 2=Venus, 4=Mars, 5=Jupiter, 6=Saturn, 7=Uranus, 8=Neptune)",
                     0);

    // Observer parameters
    opts.AddObserverPars();

    // Time information
    opts.AddDoubleParam("startJD",
                        "Starting time as a Julian date. Default will be the current Julian date",
                        CEDate::CurrentJD());
    opts.AddDoubleParam("duration",
                        "Duration for printing out results (in minutes). Results will be printed from 'startJD' to 'startJD + duration'. Default is for one 24 hour period",
                        24.0*60.0);
    opts.AddDoubleParam("step",
                        "Number of minutes between each line of the print out.",
                        30.0);
    opts.AddStringParam("method",
                        "Method for computing planet positions ('sofa' or 'jpl', default='sofa')",
                        "sofa");

    opts.AddCorrFilePars();
    return opts ;
}